

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sparse_basic.c
# Opt level: O0

void test_sparse_basic(void)

{
  wchar_t wVar1;
  int iVar2;
  sparse sparse_file3 [3];
  sparse sparse_file2 [41];
  sparse sparse_file1 [6];
  sparse sparse_file0 [10];
  archive *a;
  char *cwd;
  void *in_stack_fffffffffffffc18;
  void *extra;
  char *in_stack_fffffffffffffc20;
  wchar_t value;
  wchar_t in_stack_fffffffffffffc2c;
  char *file;
  int in_stack_fffffffffffffc38;
  int in_stack_fffffffffffffc3c;
  sparse *sparse;
  undefined4 uVar3;
  undefined4 in_stack_fffffffffffffc4c;
  archive *in_stack_fffffffffffffc50;
  undefined1 local_3a8 [4];
  int in_stack_fffffffffffffc5c;
  sparse *in_stack_fffffffffffffc60;
  char *in_stack_fffffffffffffc68;
  archive *in_stack_fffffffffffffc70;
  undefined1 local_118 [96];
  undefined1 local_b8 [168];
  archive *local_10;
  char *local_8;
  
  memcpy(local_b8,&DAT_002e1c20,0xa0);
  memcpy(local_118,&DAT_002e1cc0,0x60);
  memcpy(local_3a8,&DAT_002e1d20,0x290);
  memset(&stack0xfffffffffffffc28,0,0x30);
  value = L'\x01';
  file = (char *)0x400;
  sparse = (sparse *)0x2800;
  uVar3 = 2;
  test_sparse_whole_file_data();
  local_8 = getcwd((char *)0x0,0x1000);
  wVar1 = assertion_assert(file,in_stack_fffffffffffffc2c,value,in_stack_fffffffffffffc20,
                           in_stack_fffffffffffffc18);
  if (wVar1 != L'\0') {
    iVar2 = is_sparse_supported((char *)sparse_file2[2].size);
    if (iVar2 == 0) {
      free(local_8);
      skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_sparse_basic.c"
                     ,L'ơ');
      test_skipping(
                   "This filesystem or platform do not support the reporting of the holes of a sparse file through API such as lseek(HOLE)"
                   );
    }
    else {
      local_10 = archive_read_disk_new();
      assertion_assert(file,in_stack_fffffffffffffc2c,value,in_stack_fffffffffffffc20,
                       in_stack_fffffffffffffc18);
      verify_sparse_file(in_stack_fffffffffffffc70,in_stack_fffffffffffffc68,
                         in_stack_fffffffffffffc60,in_stack_fffffffffffffc5c);
      verify_sparse_file(in_stack_fffffffffffffc70,in_stack_fffffffffffffc68,
                         in_stack_fffffffffffffc60,in_stack_fffffffffffffc5c);
      verify_sparse_file(in_stack_fffffffffffffc70,in_stack_fffffffffffffc68,
                         in_stack_fffffffffffffc60,in_stack_fffffffffffffc5c);
      verify_sparse_file(in_stack_fffffffffffffc70,in_stack_fffffffffffffc68,
                         in_stack_fffffffffffffc60,in_stack_fffffffffffffc5c);
      archive_read_free((archive *)0x1c9536);
      extra = (void *)0x0;
      assertion_equal_int((char *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38),
                          (wchar_t)((ulong)file >> 0x20),CONCAT44(in_stack_fffffffffffffc2c,value),
                          in_stack_fffffffffffffc20,0,(char *)0x1c9564,in_stack_fffffffffffffc50);
      local_10 = archive_read_disk_new();
      assertion_assert(file,in_stack_fffffffffffffc2c,value,in_stack_fffffffffffffc20,extra);
      wVar1 = (wchar_t)((ulong)file >> 0x20);
      verify_sparse_file2(in_stack_fffffffffffffc50,
                          (char *)CONCAT44(in_stack_fffffffffffffc4c,uVar3),sparse,
                          in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38);
      verify_sparse_file2(in_stack_fffffffffffffc50,
                          (char *)CONCAT44(in_stack_fffffffffffffc4c,uVar3),sparse,
                          in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38);
      archive_read_free((archive *)0x1c95f2);
      assertion_equal_int((char *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38),
                          wVar1,CONCAT44(in_stack_fffffffffffffc2c,value),in_stack_fffffffffffffc20,
                          0,(char *)0x1c9620,in_stack_fffffffffffffc50);
      free(local_8);
    }
  }
  return;
}

Assistant:

DEFINE_TEST(test_sparse_basic)
{
	char *cwd;
	struct archive *a;
	/*
	 * The alignment of the hole of sparse files deeply depends
	 * on filesystem. In my experience, sparse_file2 test with
	 * 204800 bytes hole size did not pass on ZFS and the result
	 * of that test seemed the size was too small, thus you should
	 * keep a hole size more than 409600 bytes to pass this test
	 * on all platform.
	 */
	const struct sparse sparse_file0[] = {
		{ DATA,	 1024 }, { HOLE,   2048000 },
		{ DATA,	 2048 }, { HOLE,   2048000 },
		{ DATA,	 4096 }, { HOLE,  20480000 },
		{ DATA,	 8192 }, { HOLE, 204800000 },
		{ DATA,     1 }, { END,	0 }
	};
	const struct sparse sparse_file1[] = {
		{ HOLE,	409600 }, { DATA, 1 },
		{ HOLE,	409600 }, { DATA, 1 },
		{ HOLE,	409600 }, { END,  0 }
	};
	const struct sparse sparse_file2[] = {
		{ HOLE,	409600 * 1 }, { DATA, 1024 },
		{ HOLE,	409600 * 2 }, { DATA, 1024 },
		{ HOLE,	409600 * 3 }, { DATA, 1024 },
		{ HOLE,	409600 * 4 }, { DATA, 1024 },
		{ HOLE,	409600 * 5 }, { DATA, 1024 },
		{ HOLE,	409600 * 6 }, { DATA, 1024 },
		{ HOLE,	409600 * 7 }, { DATA, 1024 },
		{ HOLE,	409600 * 8 }, { DATA, 1024 },
		{ HOLE,	409600 * 9 }, { DATA, 1024 },
		{ HOLE,	409600 * 10}, { DATA, 1024 },/* 10 */
		{ HOLE,	409600 * 1 }, { DATA, 1024 * 1 },
		{ HOLE,	409600 * 2 }, { DATA, 1024 * 2 },
		{ HOLE,	409600 * 3 }, { DATA, 1024 * 3 },
		{ HOLE,	409600 * 4 }, { DATA, 1024 * 4 },
		{ HOLE,	409600 * 5 }, { DATA, 1024 * 5 },
		{ HOLE,	409600 * 6 }, { DATA, 1024 * 6 },
		{ HOLE,	409600 * 7 }, { DATA, 1024 * 7 },
		{ HOLE,	409600 * 8 }, { DATA, 1024 * 8 },
		{ HOLE,	409600 * 9 }, { DATA, 1024 * 9 },
		{ HOLE,	409600 * 10}, { DATA, 1024 * 10},/* 20 */
		{ END,	0 }
	};
	const struct sparse sparse_file3[] = {
 		/* This hole size is too small to create a sparse
		 * files for almost filesystem. */
		{ HOLE,	 1024 }, { DATA, 10240 },
		{ END,	0 }
	};

	/*
	 * Test for the case that sparse data indicates just the whole file
	 * data.
	 */
	test_sparse_whole_file_data();

	/* Check if the filesystem where CWD on can
	 * report the number of the holes of a sparse file. */
#ifdef PATH_MAX
	cwd = getcwd(NULL, PATH_MAX);/* Solaris getcwd needs the size. */
#else
	cwd = getcwd(NULL, 0);
#endif
	if (!assert(cwd != NULL))
		return;
	if (!is_sparse_supported(cwd)) {
		free(cwd);
		skipping("This filesystem or platform do not support "
		    "the reporting of the holes of a sparse file through "
		    "API such as lseek(HOLE)");
		return;
	}

	/*
	 * Get sparse data through directory traversals.
	 */
	assert((a = archive_read_disk_new()) != NULL);

	verify_sparse_file(a, "file0", sparse_file0, 5);
	verify_sparse_file(a, "file1", sparse_file1, 2);
	verify_sparse_file(a, "file2", sparse_file2, 20);
	verify_sparse_file(a, "file3", sparse_file3, 0);

	assertEqualInt(ARCHIVE_OK, archive_read_free(a));

	/*
	 * Get sparse data through archive_read_disk_entry_from_file().
	 */
	assert((a = archive_read_disk_new()) != NULL);

	verify_sparse_file2(a, "file0", sparse_file0, 5, 0);
	verify_sparse_file2(a, "file0", sparse_file0, 5, 1);

	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
	free(cwd);
}